

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

int Utf16ComputeByteLengthProc
              (size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
              Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  long lVar2;
  uint uVar3;
  uint *puVar4;
  long lVar5;
  size_t *byteLengthPtr;
  uint *data;
  
  if (length == 0) {
    return 0;
  }
  data = (uint *)chunks->data;
  do {
    CVar1 = chunks->format;
    if ((int)CVar1 < 4) {
      if (CVar1 == COL_UCS1) {
        lVar5 = 2;
      }
      else {
        lVar5 = 0;
        if (CVar1 == COL_UCS2) {
          uVar3 = (uint)(ushort)*data;
          goto LAB_0010a036;
        }
      }
    }
    else {
      if (CVar1 == COL_UCS4) {
        uVar3 = *data;
      }
      else if (CVar1 == COL_UTF8) {
        uVar3 = Col_Utf8Get((Col_Char1 *)data);
      }
      else {
        lVar5 = 0;
        if (CVar1 != COL_UTF16) goto LAB_0010a068;
        uVar3 = Col_Utf16Get((Col_Char2 *)data);
      }
LAB_0010a036:
      lVar5 = 2;
      if (0xd7ff < uVar3) {
        if (uVar3 < 0xe000) {
          lVar5 = 0;
        }
        else if (0xffff < uVar3) {
          lVar5 = (ulong)(uVar3 < 0x110000) << 2;
        }
      }
    }
LAB_0010a068:
    lVar2 = *clientData;
    *(long *)clientData = lVar5 + lVar2;
    if (0xfda < (ulong)(lVar5 + lVar2)) {
      return 1;
    }
    CVar1 = chunks->format;
    if ((int)CVar1 < 4) {
      if (CVar1 == COL_UCS1) {
        puVar4 = (uint *)((long)data + 1);
      }
      else {
        puVar4 = (uint *)0x0;
        if (CVar1 == COL_UCS2) {
          puVar4 = (uint *)((long)data + 2);
        }
      }
    }
    else if (CVar1 == COL_UCS4) {
      puVar4 = data + 1;
    }
    else if (CVar1 == COL_UTF8) {
      puVar4 = (uint *)Col_Utf8Next((Col_Char1 *)data);
    }
    else {
      puVar4 = (uint *)0x0;
      if (CVar1 == COL_UTF16) {
        puVar4 = (uint *)Col_Utf16Next((Col_Char2 *)data);
      }
    }
    length = length - 1;
    data = puVar4;
    if (length == 0) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
Utf16ComputeByteLengthProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to the **size_t** length variable to compute. */
    Col_ClientData clientData)
{
    size_t *byteLengthPtr = (size_t *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        *byteLengthPtr += COL_UTF16_WIDTH(c) * CHAR_WIDTH(COL_UTF16);

        /*!
         * @retval 1 stops traversal if byte length exceeds
         * #UTFSTR_MAX_BYTELENGTH.
         */

        if (*byteLengthPtr > UTFSTR_MAX_BYTELENGTH) return 1;
    }

    /*!
     * @retval 0 will continue traversal.
     */

    return 0;
}